

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O1

void __thiscall
GdlAttrValueSpec::PrettyPrint
          (GdlAttrValueSpec *this,GrcManager *pcman,ostream *strmOut,bool fXml,bool *param_4,
          bool *param_5,bool *param_6,size_t param_7)

{
  ostream *poVar1;
  string local_50;
  
  GrcSymbolTableEntry::FullAbbrev_abi_cxx11_(&local_50,this->m_psymName);
  std::__ostream_insert<char,std::char_traits<char>>
            (strmOut,local_50._M_dataplus._M_p,local_50._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(strmOut," ",1);
  GrcSymbolTableEntry::FullAbbrev_abi_cxx11_(&local_50,this->m_psymOperator);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (strmOut,local_50._M_dataplus._M_p,local_50._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  (*this->m_pexpValue->_vptr_GdlExpression[0x1d])(this->m_pexpValue,pcman,strmOut,(ulong)fXml,0);
  std::__ostream_insert<char,std::char_traits<char>>(strmOut,"; ",2);
  return;
}

Assistant:

void GdlAttrValueSpec::PrettyPrint(GrcManager * pcman, std::ostream & strmOut, bool fXml,
	bool * /*pfAtt*/, bool * /*pfAttAt*/, bool * /*pfAttWith*/, size_t /*cpavs*/)
{
	strmOut << m_psymName->FullAbbrev();
	strmOut << " " << m_psymOperator->FullAbbrev() << " ";
	m_pexpValue->PrettyPrint(pcman, strmOut, fXml);
	strmOut << "; ";
}